

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapKey::~MapKey(MapKey *this)

{
  string *this_00;
  
  if (this->type_ == 9) {
    this_00 = (this->val_).string_value_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

~MapKey() {
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
  }